

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O2

int parse_cmd_line(int argc,char **argv,nvamemtiming_conf *conf)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  code *__size;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  long lVar5;
  char **argv_00;
  ulong uVar6;
  char *pcVar7;
  size_t sStack_a8;
  nvamemtiming_conf nStack_a0;
  timeval tStack_68;
  char **ppcStack_58;
  nvamemtiming_conf *pnStack_50;
  char *pcStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  int val;
  
  conf->cnum = 0;
  conf->mmiotrace = false;
  conf->mode = MODE_AUTO;
  (conf->vbios).file = (char *)0x0;
  *(uint8_t *)&conf->field_4 = 0xff;
  *(uint8_t *)((long)&conf->field_4 + 1) = 0xff;
  pcVar7 = "hts:f:d:b:c:e:v:";
  uStack_38 = in_RAX;
switchD_001026a3_caseD_67:
  pcStack_40 = (code *)0x102690;
  iVar4 = argc;
  iVar3 = getopt(argc,argv,"hts:f:d:b:c:e:v:");
  switch(iVar3) {
  case 0x62:
    if (conf->mode != MODE_AUTO) goto switchD_001026a3_caseD_68;
    conf->mode = MODE_BITFIELD;
    break;
  case 99:
    pcStack_40 = (code *)0x1026e4;
    __isoc99_sscanf(_optarg,"%d",&val);
    conf->cnum = val;
    goto switchD_001026a3_caseD_67;
  case 100:
    if (conf->mode != MODE_AUTO) goto switchD_001026a3_caseD_68;
    conf->mode = MODE_DEEP;
    break;
  case 0x65:
    if ((conf->mode & ~MODE_MANUAL) != MODE_AUTO) goto switchD_001026a3_caseD_68;
    conf->mode = MODE_MANUAL;
    break;
  case 0x66:
    if (conf->mode == MODE_AUTO) goto LAB_00102730;
    goto switchD_001026a3_caseD_68;
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_001026a3_caseD_67;
  case 0x68:
    goto switchD_001026a3_caseD_68;
  case 0x73:
    if (conf->mode != MODE_AUTO) goto switchD_001026a3_caseD_68;
    break;
  case 0x74:
    conf->mmiotrace = true;
    goto switchD_001026a3_caseD_67;
  case 0x76:
    if ((conf->mode & ~MODE_MANUAL) != MODE_AUTO) goto switchD_001026a3_caseD_68;
    conf->mode = MODE_MANUAL;
LAB_00102730:
    pcStack_40 = (code *)0x10274b;
    __isoc99_sscanf(_optarg,"%d",&val);
    (conf->field_4).manual.value = (uint8_t)val;
    goto switchD_001026a3_caseD_67;
  default:
    goto switchD_001026a3_default;
  }
  pcStack_40 = (code *)0x10277e;
  __isoc99_sscanf(_optarg,"%d",&val);
  (conf->field_4).manual.index = (uint8_t)val;
  goto switchD_001026a3_caseD_67;
switchD_001026a3_default:
  if (iVar3 == -1) {
    if (conf->cnum < nva_cardsnum) {
      pcVar7 = &optind;
      lVar5 = (long)_optind;
      if (_optind + 4 != argc) goto switchD_001026a3_caseD_68;
      (conf->vbios).file = argv[lVar5];
      iVar4 = 0;
      pcStack_40 = (code *)0x1027e5;
      __isoc99_sscanf(argv[lVar5 + 1],"%hx",&(conf->vbios).timing_table_offset);
      lVar5 = (long)_optind;
      pcStack_40 = (code *)0x1027f2;
      iVar3 = atoi(argv[lVar5 + 2]);
      (conf->timing).entry = (uint8_t)iVar3;
      pcStack_40 = (code *)0x102800;
      iVar3 = atoi(argv[lVar5 + 3]);
      (conf->timing).perflvl = (uint8_t)iVar3;
    }
    else {
      if (nva_cardsnum == 0) {
        pcVar7 = "No cards found.\n";
        pcStack_40 = (code *)0x10;
      }
      else {
        pcVar7 = "No such card.\n";
        pcStack_40 = (code *)0xe;
      }
      __size = pcStack_40;
      pcStack_40 = (code *)0x102840;
      fwrite(pcVar7,(size_t)__size,1,_stderr);
      iVar4 = 1;
    }
    return iVar4;
  }
  goto switchD_001026a3_caseD_67;
switchD_001026a3_caseD_68:
  pcStack_40 = main;
  argv_00 = argv;
  usage(iVar4,argv);
  ppcStack_58 = argv;
  pnStack_50 = conf;
  pcStack_48 = pcVar7;
  pcStack_40 = (code *)(ulong)(uint)argc;
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar3 = nva_init();
  if (iVar3 == 0) {
    parse_cmd_line(iVar4,argv_00,&nStack_a0);
    iVar4 = vbios_read(nStack_a0.vbios.file,&nStack_a0.vbios.data,&nStack_a0.vbios.length);
    if (iVar4 == 1) {
      iVar4 = read_timings(&nStack_a0);
      if (iVar4 != 0) {
        fwrite("read_timings failed!\n",0x15,1,_stderr);
        return -1;
      }
      iVar4 = 0;
      gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
      _Var2 = tStack_68.tv_sec;
      switch(nStack_a0.mode) {
      case MODE_AUTO:
        iVar4 = shallow_dump(&nStack_a0);
        break;
      case MODE_BITFIELD:
        iVar4 = bitfield_check(&nStack_a0);
        break;
      case MODE_MANUAL:
        iVar4 = manual_check(&nStack_a0);
        break;
      case MODE_DEEP:
        iVar4 = deep_dump(&nStack_a0);
      }
      gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
      uVar6 = tStack_68.tv_sec - _Var2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)nStack_a0.counter,
             uVar6 / 0xe10,(ulong)(ushort)(SUB162(auVar1 % ZEXT816(0xe10),0) / 0x3c),uVar6 % 0x3c);
      return iVar4;
    }
    pcVar7 = "Error while reading the vbios\n";
    sStack_a8 = 0x1e;
  }
  else {
    pcVar7 = "PCI init failure!\n";
    sStack_a8 = 0x12;
  }
  fwrite(pcVar7,sStack_a8,1,_stderr);
  return 1;
}

Assistant:

int parse_cmd_line(int argc, char **argv, struct nvamemtiming_conf *conf)
{
	int c, val;

	conf->cnum = 0;
	conf->mmiotrace = false;
	conf->mode = MODE_AUTO;
	conf->vbios.file = NULL;
	conf->range.start = -1;
	conf->range.end = -1;

	while ((c = getopt (argc, argv, "hts:f:d:b:c:e:v:")) != -1)
		switch (c) {
			case 'e':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.index = val;
				break;
			case 'v':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.value = val;
				break;
			case 'd':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_DEEP;
				sscanf(optarg, "%d", &val);
				conf->deep.entry = val;
				break;
			case 'b':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_BITFIELD;
				sscanf(optarg, "%d", &val);
				conf->bitfield.index = val;
				break;
			case 's':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.start = val;
				break;
			case 'f':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.end = val;
				break;
			case 'c':
				sscanf(optarg, "%d", &val);
				conf->cnum = val;
				break;
			case 't':
				conf->mmiotrace = true;
				break;
			case 'h':
				usage(argc, argv);
		}
	if (conf->cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (argc != optind + 4)
		usage(argc, argv);

	conf->vbios.file = argv[optind];
	sscanf(argv[optind + 1], "%hx", &conf->vbios.timing_table_offset);
	conf->timing.entry = atoi(argv[optind + 2]);
	conf->timing.perflvl = atoi(argv[optind + 3]);

	return 0;
}